

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderStairs<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLin>
               (GetterXsYs<int> *getter,TransformerLinLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  ImPlotContext *pIVar5;
  long lVar6;
  ImPlotContext *pIVar7;
  int iVar8;
  ImPlotContext *gp;
  int iVar9;
  float fVar10;
  ImVec2 p12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_78;
  ImDrawList *local_70;
  ImVec2 local_68;
  TransformerLinLin *local_60;
  undefined1 local_58 [8];
  TransformerLinLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar5 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  local_70 = DrawList;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar8 = getter->Count;
    local_48 = iVar8 + -1;
    local_40 = line_weight * 0.5;
    lVar6 = (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
    iVar8 = transformer->YAxis;
    IVar2 = GImPlot->PixelRange[iVar8].Min;
    local_3c.x = (float)(GImPlot->Mx *
                         ((double)*(int *)((long)getter->Xs + lVar6) - (pIVar4->XAxis).Range.Min) +
                        (double)IVar2.x);
    local_3c.y = (float)(GImPlot->My[iVar8] *
                         ((double)*(int *)((long)getter->Ys + lVar6) -
                         pIVar4->YAxis[iVar8].Range.Min) + (double)IVar2.y);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLin>>
              ((StairsRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLinLin> *)local_58,
               DrawList,&pIVar4->PlotRect);
  }
  else {
    iVar8 = getter->Count;
    lVar6 = (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
    iVar9 = transformer->YAxis;
    IVar2 = GImPlot->PixelRange[iVar9].Min;
    local_58._4_4_ =
         (undefined4)
         (GImPlot->My[iVar9] *
          ((double)*(int *)((long)getter->Ys + lVar6) - pIVar4->YAxis[iVar9].Range.Min) +
         (double)IVar2.y);
    local_58._0_4_ =
         (undefined4)
         (GImPlot->Mx * ((double)*(int *)((long)getter->Xs + lVar6) - (pIVar4->XAxis).Range.Min) +
         (double)IVar2.x);
    if (1 < iVar8) {
      iVar9 = 1;
      pIVar7 = GImPlot;
      local_60 = transformer;
      do {
        local_78.y = (float)local_58._4_4_;
        lVar6 = (long)(((getter->Offset + iVar9) % iVar8 + iVar8) % iVar8) * (long)getter->Stride;
        iVar3 = transformer->YAxis;
        IVar2 = pIVar7->PixelRange[iVar3].Min;
        local_78.x = (float)(pIVar7->Mx *
                             ((double)*(int *)((long)getter->Xs + lVar6) -
                             (pIVar7->CurrentPlot->XAxis).Range.Min) + (double)IVar2.x);
        local_68.y = (float)(pIVar7->My[iVar3] *
                             ((double)*(int *)((long)getter->Ys + lVar6) -
                             pIVar7->CurrentPlot->YAxis[iVar3].Range.Min) + (double)IVar2.y);
        pIVar4 = pIVar5->CurrentPlot;
        fVar10 = (float)local_58._4_4_;
        if (local_68.y <= (float)local_58._4_4_) {
          fVar10 = local_68.y;
        }
        if ((fVar10 < (pIVar4->PlotRect).Max.y) &&
           (fVar10 = (float)(~-(uint)(local_68.y <= (float)local_58._4_4_) & (uint)local_68.y |
                            -(uint)(local_68.y <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar10 && fVar10 != *pfVar1)) {
          fVar10 = (float)local_58._0_4_;
          if (local_78.x <= (float)local_58._0_4_) {
            fVar10 = local_78.x;
          }
          if ((fVar10 < (pIVar4->PlotRect).Max.x) &&
             (fVar10 = (float)(-(uint)(local_78.x <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(local_78.x <= (float)local_58._0_4_) & (uint)local_78.x),
             (pIVar4->PlotRect).Min.x <= fVar10 && fVar10 != (pIVar4->PlotRect).Min.x)) {
            local_68.x = local_78.x;
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_78,col,line_weight);
            ImDrawList::AddLine(DrawList,&local_78,&local_68,col,line_weight);
            iVar8 = getter->Count;
            pIVar7 = GImPlot;
            transformer = local_60;
            local_78.x = local_68.x;
          }
        }
        iVar9 = iVar9 + 1;
        local_58._0_4_ = local_78.x;
        local_58._4_4_ = local_68.y;
      } while (iVar9 < iVar8);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}